

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

void google::CaptureTestOutput(int fd,string *filename)

{
  pointer pcVar1;
  CapturedStream *__ptr;
  CapturedStream *this;
  ostream *poVar2;
  default_delete<google::CapturedStream> *this_00;
  LogMessage local_90;
  
  if (fd - 3U < 0xfffffffe) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15b);
    poVar2 = LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Check failed: (fd == STDOUT_FILENO) || (fd == STDERR_FILENO) ",0x3d);
  }
  else {
    if (*(long *)(s_captured_streams + (ulong)(uint)fd * 8) == 0) {
      this = (CapturedStream *)operator_new(0x28);
      pcVar1 = (filename->_M_dataplus)._M_p;
      local_90.allocated_ = (LogMessageData *)&local_90.time_;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + filename->_M_string_length);
      CapturedStream::CapturedStream(this,fd,(string *)&local_90);
      this_00 = (default_delete<google::CapturedStream> *)(s_captured_streams + (ulong)(uint)fd * 8)
      ;
      if (local_90.allocated_ != (LogMessageData *)&local_90.time_) {
        free(local_90.allocated_);
      }
      __ptr = *(CapturedStream **)this_00;
      *(CapturedStream **)this_00 = this;
      if (__ptr != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()(this_00,__ptr);
      }
      return;
    }
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar2 = LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Check failed: s_captured_streams[fd] == nullptr ",0x30);
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

static inline void CaptureTestOutput(int fd, const string& filename) {
  CHECK((fd == STDOUT_FILENO) || (fd == STDERR_FILENO));
  CHECK(s_captured_streams[fd] == nullptr);
  s_captured_streams[fd] = std::make_unique<CapturedStream>(fd, filename);
}